

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void * gtemplate_donew(t_symbol *sym,int argc,t_atom *argv)

{
  undefined4 uVar1;
  _gtemplate *p_Var2;
  int iVar3;
  _gtemplate *owner;
  _glist *p_Var4;
  t_atom *ptVar5;
  t_template *ptVar6;
  t_atom *ptVar7;
  t_template *y;
  _gtemplate *x3;
  _gtemplate *x2;
  t_symbol *sx;
  t_template *ptStack_30;
  int i;
  t_template *t;
  _gtemplate *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *sym_local;
  
  owner = (_gtemplate *)pd_new(gtemplate_class);
  ptStack_30 = template_findbyname(sym);
  gensym("x");
  p_Var4 = canvas_getcurrent();
  owner->x_owner = p_Var4;
  owner->x_next = (_gtemplate *)0x0;
  owner->x_sym = sym;
  owner->x_argc = argc;
  ptVar5 = (t_atom *)getbytes((long)argc << 4);
  owner->x_argv = ptVar5;
  for (sx._4_4_ = 0; sx._4_4_ < argc; sx._4_4_ = sx._4_4_ + 1) {
    ptVar5 = owner->x_argv + sx._4_4_;
    ptVar7 = argv + sx._4_4_;
    uVar1 = *(undefined4 *)&ptVar7->field_0x4;
    ptVar5->a_type = ptVar7->a_type;
    *(undefined4 *)&ptVar5->field_0x4 = uVar1;
    ptVar5->a_w = ptVar7->a_w;
  }
  if (ptStack_30 == (t_template *)0x0) {
    ptVar6 = template_new(sym,argc,argv);
    owner->x_template = ptVar6;
    ptVar6->t_list = owner;
  }
  else {
    owner->x_template = ptStack_30;
    if (ptStack_30->t_list == (_gtemplate *)0x0) {
      ptVar6 = template_new(&s_,argc,argv);
      canvas_redrawallfortemplate(ptStack_30,2);
      iVar3 = template_match(ptStack_30,ptVar6);
      if (iVar3 == 0) {
        template_conform(ptStack_30,ptVar6);
        pd_free(&ptStack_30->t_pdobj);
        ptStack_30 = template_new(sym,argc,argv);
        owner->x_template = ptStack_30;
      }
      pd_free(&ptVar6->t_pdobj);
      ptStack_30->t_list = owner;
      canvas_redrawallfortemplate(ptStack_30,1);
    }
    else {
      p_Var2 = owner->x_template->t_list;
      do {
        x3 = p_Var2;
        p_Var2 = x3->x_next;
      } while (x3->x_next != (_gtemplate *)0x0);
      x3->x_next = owner;
      post("template %s: warning: already exists.",sym->s_name);
    }
  }
  outlet_new((t_object *)owner,(t_symbol *)0x0);
  return owner;
}

Assistant:

static void *gtemplate_donew(t_symbol *sym, int argc, t_atom *argv)
{
    t_gtemplate *x = (t_gtemplate *)pd_new(gtemplate_class);
    t_template *t = template_findbyname(sym);
    int i;
    t_symbol *sx = gensym("x");
    x->x_owner = canvas_getcurrent();
    x->x_next = 0;
    x->x_sym = sym;
    x->x_argc = argc;
    x->x_argv = (t_atom *)getbytes(argc * sizeof(t_atom));
    for (i = 0; i < argc; i++)
        x->x_argv[i] = argv[i];

        /* already have a template by this name? */
    if (t)
    {
        x->x_template = t;
            /* if it's already got a "struct" object we
            just tack this one to the end of the list and leave it
            there. */
        if (t->t_list)
        {
            t_gtemplate *x2, *x3;
            for (x2 = x->x_template->t_list; (x3 = x2->x_next); x2 = x3)
                ;
            x2->x_next = x;
            post("template %s: warning: already exists.", sym->s_name);
        }
        else
        {
                /* if there's none, we just replace the template with
                our own and conform it. */
            t_template *y = template_new(&s_, argc, argv);
            canvas_redrawallfortemplate(t, 2);
                /* Unless the new template is different from the old one,
                there's nothing to do.  */
            if (!template_match(t, y))
            {
                    /* conform everyone to the new template */
                template_conform(t, y);
                pd_free(&t->t_pdobj);
                x->x_template = t = template_new(sym, argc, argv);
            }
            pd_free(&y->t_pdobj);
            t->t_list = x;
            canvas_redrawallfortemplate(t, 1);
        }
    }
    else
    {
            /* otherwise make a new one and we're the only struct on it. */
        x->x_template = t = template_new(sym, argc, argv);
        t->t_list = x;
    }
    outlet_new(&x->x_obj, 0);
    return (x);
}